

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::visit_typed_array(basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                    *this,long *param_2,byte param_3,undefined8 param_4,int *param_5)

{
  int iVar1;
  ushort *puVar2;
  bool bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  byte_string_view local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if ((this->options_).use_typed_arrays_ == true) {
    std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
    std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_48,param_2[1] * 2,(allocator_type *)&local_58);
    memcpy(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,(void *)*param_2,param_2[1] * 2);
    local_58.data_ =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_58.size_ =
         (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    write_byte_string(this,&local_58);
    basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::string,void>,std::allocator<char>>::
    visit_typed_array();
  }
  else {
    (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[7])(this,param_2[1],0);
    if (*param_5 == 0) {
      bVar3 = param_2[1] == 0;
      if (!bVar3) {
        puVar2 = (ushort *)*param_2;
        (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[0x11])
                  (this,(ulong)*puVar2,(ulong)param_3,param_4,param_5);
        iVar1 = *param_5;
        while (iVar1 == 0) {
          puVar2 = puVar2 + 1;
          bVar3 = puVar2 == (ushort *)(param_2[1] * 2 + *param_2);
          if (bVar3) goto LAB_0025718d;
          (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[0x11])
                    (this,(ulong)*puVar2,(ulong)param_3,param_4,param_5);
          iVar1 = *param_5;
        }
        if (!bVar3) {
          return true;
        }
      }
LAB_0025718d:
      (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])(this,param_4,param_5);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(half_arg_t, const jsoncons::span<const uint16_t>& data,  
        semantic_tag tag,
        const ser_context& context, 
        std::error_code& ec) override
    {
        if (options_.use_typed_arrays())
        {
            write_typed_array_tag(std::integral_constant<bool, jsoncons::endian::native == jsoncons::endian::big>(), 
                                  half_arg, 
                                  tag);
            std::vector<uint8_t> v(data.size()*sizeof(uint16_t));
            std::memcpy(v.data(),data.data(),data.size()*sizeof(uint16_t));
            write_byte_string(byte_string_view(v));
            JSONCONS_VISITOR_RETURN;
        }
        else
        {
            this->begin_array(data.size(), semantic_tag::none, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            for (auto p = data.begin(); p != data.end(); ++p)
            {
                this->half_value(*p, tag, context, ec);
                if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            }
            this->end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }
    }